

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsLpRelaxation.cpp
# Opt level: O3

bool __thiscall HighsLpRelaxation::checkDualProof(HighsLpRelaxation *this)

{
  double *pdVar1;
  int iVar2;
  pointer piVar3;
  bool bVar4;
  ulong uVar5;
  ulong uVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  
  bVar4 = true;
  if (this->hasdualproof == true) {
    if (this->dualproofrhs < INFINITY) {
      piVar3 = (this->dualproofinds).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      dVar7 = -this->dualproofrhs;
      uVar5 = (ulong)((long)(this->dualproofinds).super__Vector_base<int,_std::allocator<int>_>.
                            _M_impl.super__Vector_impl_data._M_finish - (long)piVar3) >> 2;
      if ((int)uVar5 == 0) {
        dVar8 = 0.0;
      }
      else {
        uVar6 = 0;
        dVar8 = 0.0;
        dVar9 = dVar7;
        do {
          iVar2 = piVar3[uVar6];
          dVar10 = (this->dualproofvals).super__Vector_base<double,_std::allocator<double>_>._M_impl
                   .super__Vector_impl_data._M_start[uVar6];
          if (dVar10 <= 0.0) {
            dVar7 = (this->lpsolver).model_.lp_.col_upper_.
                    super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start[iVar2];
            if (INFINITY <= dVar7) goto LAB_002ac925;
          }
          else {
            dVar7 = (this->lpsolver).model_.lp_.col_lower_.
                    super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start[iVar2];
            if (dVar7 <= -INFINITY) goto LAB_002ac925;
          }
          dVar10 = dVar10 * dVar7;
          dVar7 = dVar9 + dVar10;
          dVar8 = dVar8 + (dVar9 - (dVar7 - dVar10)) + (dVar10 - (dVar7 - (dVar7 - dVar10)));
          uVar6 = uVar6 + 1;
          dVar9 = dVar7;
        } while ((uVar5 & 0xffffffff) != uVar6);
      }
      pdVar1 = &((this->mipsolver->mipdata_)._M_t.
                 super___uniq_ptr_impl<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_HighsMipSolverData_*,_std::default_delete<HighsMipSolverData>_>
                 .super__Head_base<0UL,_HighsMipSolverData_*,_false>._M_head_impl)->feastol;
      return *pdVar1 <= dVar8 + dVar7 && dVar8 + dVar7 != *pdVar1;
    }
LAB_002ac925:
    bVar4 = false;
  }
  return bVar4;
}

Assistant:

bool HighsLpRelaxation::checkDualProof() const {
  if (!hasdualproof) return true;
  if (dualproofrhs == kHighsInf) return false;

  HighsInt len = dualproofinds.size();

  HighsCDouble viol = -dualproofrhs;

  const HighsLp& lp = lpsolver.getLp();

  for (HighsInt i = 0; i != len; ++i) {
    HighsInt col = dualproofinds[i];
    if (dualproofvals[i] > 0) {
      if (lp.col_lower_[col] == -kHighsInf) return false;
      viol += dualproofvals[i] * lp.col_lower_[col];
    } else {
      assert(dualproofvals[i] < 0);
      if (lp.col_upper_[col] == kHighsInf) return false;
      viol += dualproofvals[i] * lp.col_upper_[col];
    }
  }

  return viol > mipsolver.mipdata_->feastol;
}